

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::AnyMetadata::InternalIs(AnyMetadata *this,StringPiece type_name)

{
  string *psVar1;
  size_type sVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  bool bVar6;
  undefined1 *local_60;
  string *local_58;
  undefined1 local_50 [16];
  undefined1 *local_40;
  string *local_38;
  undefined1 local_30 [16];
  
  uVar4 = type_name.length_;
  pcVar5 = type_name.ptr_;
  psVar1 = this->type_url_->ptr_;
  sVar2 = psVar1->_M_string_length;
  if (((long)sVar2 <= (long)uVar4) || ((psVar1->_M_dataplus)._M_p[~uVar4 + sVar2] != '/')) {
    return false;
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40);
  local_60 = local_50;
  if (pcVar5 == (char *)0x0) {
    local_58 = (string *)0x0;
    local_50[0] = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,pcVar5,pcVar5 + uVar4);
    if (local_38 < local_58) {
      bVar6 = false;
      goto LAB_002a665a;
    }
  }
  iVar3 = std::__cxx11::string::compare((ulong)&local_40,(long)local_38 - (long)local_58,local_58);
  bVar6 = iVar3 == 0;
LAB_002a665a:
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if (local_40 == local_30) {
    return bVar6;
  }
  operator_delete(local_40);
  return bVar6;
}

Assistant:

bool AnyMetadata::InternalIs(StringPiece type_name) const {
  StringPiece type_url = Get(type_url_);
  return type_url.size() >= type_name.size() + 1 &&
         type_url[type_url.size() - type_name.size() - 1] == '/' &&
         HasSuffixString(type_url, type_name);
}